

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::byteDRUP(Solver *this,Lit l)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uchar *in_RCX;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  uchar *in_RSI;
  uchar *sig;
  long in_RDI;
  size_t in_R8;
  uint u;
  uint local_14;
  
  sig = in_RSI;
  iVar2 = var((Lit)(int)in_RSI);
  iVar3 = sign((EVP_PKEY_CTX *)((ulong)in_RSI & 0xffffffff),sig,
               (size_t *)CONCAT71(extraout_var,extraout_DL),in_RCX,in_R8);
  local_14 = (iVar2 + 1) * 2 + (uint)((byte)iVar3 & 1);
  do {
    pbVar1 = *(byte **)(in_RDI + 0x680);
    *(byte **)(in_RDI + 0x680) = pbVar1 + 1;
    *pbVar1 = (byte)local_14 & 0x7f | 0x80;
    *(int *)(in_RDI + 0x678) = *(int *)(in_RDI + 0x678) + 1;
    local_14 = local_14 >> 7;
  } while (local_14 != 0);
  *(byte *)(*(long *)(in_RDI + 0x680) + -1) = *(byte *)(*(long *)(in_RDI + 0x680) + -1) & 0x7f;
  return;
}

Assistant:

inline void byteDRUP(Lit l)
    {
        unsigned int u = 2 * (var(l) + 1) + sign(l);
        do {
            *buf_ptr++ = (u & 0x7f) | 0x80;
            buf_len++;
            u = u >> 7;
        } while (u);
        *(buf_ptr - 1) &= 0x7f; // End marker of this unsigned number.
    }